

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O0

void __thiscall
draco::ObjEncoder::FindOriginalFaceEdges
          (ObjEncoder *this,FaceIndex face_index,CornerTable *corner_table,
          vector<bool,_std::allocator<bool>_> *triangle_visited,PolygonEdges *polygon_edges)

{
  bool bVar1;
  const_reference pvVar2;
  CornerTable *in_RCX;
  ObjEncoder *in_RDX;
  uint in_ESI;
  value_type *in_RDI;
  Mesh *in_R8;
  reference rVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>,_bool>
  pVar4;
  PointIndex point_to;
  PointIndex point_from;
  FaceIndex opposite_face_index;
  bool is_new_edge;
  CornerIndex co;
  CornerIndex ci;
  size_t c;
  Face *face;
  Mesh *in_stack_ffffffffffffff28;
  CornerTable *this_00;
  _Rb_tree_iterator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  in_stack_ffffffffffffff48;
  CornerIndex in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_a4;
  pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
  local_a0;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_80;
  byte local_79;
  uint local_78;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_74;
  undefined4 local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  ulong local_60;
  uint local_54;
  Face *local_50;
  reference local_48;
  CornerTable *corner_table_00;
  value_type *pvVar5;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_4;
  
  this_00 = in_RCX;
  pvVar5 = in_RDI;
  local_4.value_ = in_ESI;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value(&local_4);
  rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50.value_),
                     (size_type)in_stack_ffffffffffffff48._M_node);
  bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffc8);
  if (!bVar1) {
    corner_table_00 = this_00;
    IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value(&local_4);
    local_48 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50.value_),
                          (size_type)in_stack_ffffffffffffff48._M_node);
    std::_Bit_reference::operator=(&local_48,true);
    local_54 = local_4.value_;
    local_50 = Mesh::face(in_stack_ffffffffffffff28,(FaceIndex)(uint)((ulong)this_00 >> 0x20));
    for (local_60 = 0; local_60 < 3; local_60 = local_60 + 1) {
      local_6c = local_4.value_;
      local_68 = (uint)CornerTable::FirstCorner
                                 ((CornerTable *)in_stack_ffffffffffffff28,(FaceIndex)(uint)this_00)
      ;
      local_70 = (undefined4)local_60;
      local_78 = (uint)IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator+
                                 ((IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                  in_stack_ffffffffffffff28,(uint *)0x124e5d);
      local_64 = local_78;
      local_74.value_ =
           (uint)CornerTable::Opposite((CornerTable *)in_stack_ffffffffffffff28,(uint)this_00);
      local_80 = local_64;
      local_79 = IsNewEdge((ObjEncoder *)in_stack_ffffffffffffff48._M_node,in_RCX,
                           in_stack_ffffffffffffff50);
      if ((!(bool)local_79) &&
         (bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                            (&local_74,
                             (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                             &kInvalidCornerIndex), bVar1)) {
        local_84 = local_74.value_;
        local_79 = IsNewEdge((ObjEncoder *)in_stack_ffffffffffffff48._M_node,in_RCX,
                             in_stack_ffffffffffffff50);
      }
      if (((local_79 & 1) == 0) ||
         (bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                            (&local_74,
                             (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                             &kInvalidCornerIndex), !bVar1)) {
        pvVar2 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::
                 operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                             *)this_00,(size_type)in_stack_ffffffffffffff28);
        local_94 = pvVar2->value_;
        pvVar2 = std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::
                 operator[]((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>
                             *)this_00,(size_type)in_stack_ffffffffffffff28);
        in_stack_ffffffffffffff28 = in_R8;
        local_98.value_ = pvVar2->value_;
        in_R8 = in_stack_ffffffffffffff28;
        local_a4.value_ =
             (uint)PointAttribute::mapped_index
                             ((PointAttribute *)in_stack_ffffffffffffff28,(uint)this_00);
        std::
        pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>
        ::pair<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_true>
                  (&local_a0,&local_a4,&local_98);
        pVar4 = std::
                map<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
                ::insert((map<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::less<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_std::allocator<std::pair<const_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>_>
                          *)in_RCX,in_RDI);
        in_stack_ffffffffffffff48 = pVar4.first._M_node;
        in_stack_ffffffffffffff50.value_ =
             CONCAT31((int3)(in_stack_ffffffffffffff50.value_ >> 8),pVar4.second);
      }
      else {
        local_8c = local_74.value_;
        local_90 = (uint)CornerTable::Face((CornerTable *)in_stack_ffffffffffffff28,
                                           (CornerIndex)(uint)this_00);
        local_88 = local_90;
        FindOriginalFaceEdges
                  (in_RDX,(FaceIndex)(uint)((ulong)pvVar5 >> 0x20),corner_table_00,
                   (vector<bool,_std::allocator<bool>_> *)in_R8,(PolygonEdges *)rVar3._M_mask);
      }
    }
  }
  return;
}

Assistant:

void ObjEncoder::FindOriginalFaceEdges(FaceIndex face_index,
                                       const CornerTable &corner_table,
                                       std::vector<bool> *triangle_visited,
                                       PolygonEdges *polygon_edges) {
  // Do not add any edges if this triangular face has already been visited.
  if ((*triangle_visited)[face_index.value()]) {
    return;
  }
  (*triangle_visited)[face_index.value()] = true;
  const Mesh::Face &face = in_mesh_->face(face_index);
  for (size_t c = 0; c < 3; c++) {
    // Check for added edge using this corner.
    const CornerIndex ci = corner_table.FirstCorner(face_index) + c;
    const CornerIndex co = corner_table.Opposite(ci);
    bool is_new_edge = IsNewEdge(corner_table, ci);

    // Check for the new edge using the opposite corner.
    if (!is_new_edge && co != kInvalidCornerIndex) {
      is_new_edge = IsNewEdge(corner_table, co);
    }
    // The new edge may become a boundary edge when a degenerate triangle
    // created by polygon triangulation is removed by Draco encoder, hence |co|
    // is checked below. This can happen when an isolated (boundary) quad only
    // has three distinct vertex positions.
    //
    // TODO(vytyaz): Fix polygon reconstruction with other possible cases of
    // degenerate triangles. There are two known sources of degenerate triangles
    // that affect polygon reconstruction:
    //
    // 1. Degenerate triangles created during polygon triangulation are removed
    //    by Draco encoder, which invalidates the "added_edges" attribute.
    //    Solution is to discard those triangles before creating the attribute.
    //
    // 2. Degenerate triangles created by position quantization are encoded and
    //    decoded by Draco, but not captured into the |corner_table|, causing a
    //    mismatch between the corner table and the "added_edges" attribute.
    //    Solution is to use corner table from draco::MeshDecoder here.
    //
    if (is_new_edge && co != kInvalidCornerIndex) {
      // Visit triangle across the new edge.
      const FaceIndex opposite_face_index = corner_table.Face(co);
      FindOriginalFaceEdges(opposite_face_index, corner_table, triangle_visited,
                            polygon_edges);
    } else {
      // Insert the original edge to the map.
      const PointIndex point_from = face[(c + 1) % 3];
      const PointIndex point_to = face[(c + 2) % 3];
      polygon_edges->insert(
          {PositionIndex(pos_att_->mapped_index(point_from)), point_to});
    }
  }
}